

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::format<char[9]>(ostream *out,char *fmt,char (*args) [9])

{
  long lVar1;
  ostream *in_RSI;
  char (*in_RDI) [9];
  long in_FS_OFFSET;
  FormatListRef in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  makeFormatList<char[9]>(in_RDI);
  vformat(in_RSI,*in_RDI,in_stack_ffffffffffffff98);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}